

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::retry_web_seed
          (torrent *this,peer_connection *p,
          optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> retry)

{
  bool bVar1;
  pointer pwVar2;
  session_settings *this_00;
  int local_5c;
  duration<int,_std::ratio<1L,_1L>_> local_58;
  duration<int,_std::ratio<1L,_1L>_> local_54;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_50;
  duration local_4c;
  _Self local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  _List_iterator<libtorrent::aux::web_seed_t> local_30;
  _Self local_28;
  _List_iterator<libtorrent::aux::web_seed_t> i;
  peer_connection *p_local;
  torrent *this_local;
  optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> retry_local;
  
  i._M_node = (_List_node_base *)p;
  this_local = (torrent *)
               retry.
               super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
               _M_payload.
               super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>;
  local_30._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::begin
                 (&this->m_web_seeds);
  local_38 = (_List_node_base *)
             ::std::__cxx11::
             list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                       (&this->m_web_seeds);
  local_40 = i._M_node;
  local_28._M_node =
       (_List_node_base *)
       ::std::
       find_if<std::_List_iterator<libtorrent::aux::web_seed_t>,libtorrent::aux::torrent::retry_web_seed(libtorrent::aux::peer_connection*,std::optional<std::chrono::duration<int,std::ratio<1l,1l>>>)::__0>
                 (local_30,(_List_iterator<libtorrent::aux::web_seed_t>)local_38,i._M_node);
  local_48._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                 (&this->m_web_seeds);
  bVar1 = ::std::operator==(&local_28,&local_48);
  if (((!bVar1) &&
      (pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_28),
      (pwVar2->removed & 1U) == 0)) &&
     (pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_28),
     (pwVar2->disabled & 1U) == 0)) {
    local_50.__d.__r = (duration)time_now32();
    this_00 = settings(this);
    local_5c = session_settings::get_int(this_00,0x400d);
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_58,&local_5c);
    local_54 = ::std::optional<std::chrono::duration<int,std::ratio<1l,1l>>>::
               value_or<std::chrono::duration<int,std::ratio<1l,1l>>>
                         ((optional<std::chrono::duration<int,std::ratio<1l,1l>>> *)&this_local,
                          &local_58);
    local_4c.__r = (rep_conflict)::std::chrono::operator+(&local_50,&local_54);
    pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_28);
    *(rep_conflict *)&(pwVar2->super_web_seed_entry).field_0x5c = local_4c.__r;
  }
  return;
}

Assistant:

void torrent::retry_web_seed(peer_connection* p, std::optional<seconds32> const retry)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [p] (web_seed_t const& ws) { return ws.peer_info.connection == p; });

		TORRENT_ASSERT(i != m_web_seeds.end());
		if (i == m_web_seeds.end()) return;
		if (i->removed || i->disabled) return;
		i->retry = aux::time_now32() + retry.value_or(seconds32(
			settings().get_int(settings_pack::urlseed_wait_retry)));
	}